

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

string * __thiscall MD5::hexdigest_abi_cxx11_(MD5 *this)

{
  byte *in_RSI;
  string *in_RDI;
  int i;
  char buf [33];
  allocator<char> local_4d;
  int local_4c;
  char local_48 [8];
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  allocator<char> local_11 [17];
  
  if ((*in_RSI & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::allocator<char>::~allocator(local_11);
  }
  else {
    for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
      sprintf(local_48 + (local_4c << 1),"%02x",(ulong)in_RSI[(long)local_4c + 0x5c]);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::allocator<char>::~allocator(&local_4d);
  }
  return in_RDI;
}

Assistant:

std::string MD5::hexdigest() const
{
  if (!finalized)
    return "";
 
  char buf[33];
  for (int i=0; i<16; i++)
    sprintf(buf+i*2, "%02x", digest[i]);
  buf[32]=0;
 
  return std::string(buf);
}